

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_NoBasicConstraintsCertSign_Test::TestBody
          (X509Test_NoBasicConstraintsCertSign_Test *this)

{
  int iVar1;
  char *message;
  char *in_R9;
  _Any_data *configure_callback;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  AssertionResult gtest_ar;
  _Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_c8;
  string local_a8;
  UniquePtr<X509> intermediate;
  allocator_type local_7a;
  allocator_type local_79;
  AssertionResult gtest_ar_;
  UniquePtr<X509> leaf;
  UniquePtr<X509> root;
  int local_50;
  int local_4c;
  tuple<x509_st_*,_bssl::internal::Deleter> local_48;
  tuple<x509_st_*,_bssl::internal::Deleter> local_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  CertFromPEM((anon_unknown_dwarf_862632 *)&root,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_862632 *)&intermediate,
              "\n-----BEGIN CERTIFICATE-----\nMIIBqjCCAROgAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowHzEdMBsGA1UEAxMUTm8gQmFzaWMgQ29uc3RyYWludHMw\nWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASEFMblfxIEDO8My7wHtHWTuDzNyID1\nOsPkMGkn32O/pSyXxXuAqDeFoMVffUMTyfm8JcYugSEbrv2qEXXM4bZRoy8wLTAO\nBgNVHQ8BAf8EBAMCAgQwGwYDVR0jBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkq\nhkiG9w0BAQsFAAOBgQC1Lh6hIAm3K5kRh5iIydU0YAEm7eV6ZSskERDUq3DLJyl9\nZUZCHUzvb464dkwZjeNzaUVS1pdElJslwX3DtGgeJLJGCnk8zUjBjaNrrDm0kzPW\nxKt/6oif1ci/KCKqKNXJAIFbc4e+IiBpenwpxHk3If4NM+Ek0nKoO8Uj0NkgTQ==\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_862632 *)&leaf,
              "\n-----BEGIN CERTIFICATE-----\nMIIBUDCB96ADAgECAgEDMAoGCCqGSM49BAMCMB8xHTAbBgNVBAMTFE5vIEJhc2lj\nIENvbnN0cmFpbnRzMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAx\nMS8wLQYDVQQDEyZMZWFmIGZyb20gQ0Egd2l0aCBubyBCYXNpYyBDb25zdHJhaW50\nczBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABEsYPMwzdJKjB+2gpC90ib2ilHoB\nw/arQ6ikUX0CNUDDaKaOu/jF39ogzVlg4lDFrjCKShSfCCcrwgONv70IZGijEDAO\nMAwGA1UdEwEB/wQCMAAwCgYIKoZIzj0EAwIDSAAwRQIgbV7R99yM+okXSIs6Fp3o\neCOXiDL60IBxaTOcLS44ywcCIQDbn87Gj5cFgHBYAkzdHqDsyGXkxQTHDq9jmX24\nDjy3Zw==\n-----END CERTIFICATE-----\n"
             );
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)0x520523,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xb73,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_c8);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)0x4fe128,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xb74,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_c8);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
           leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)0x4fe166,"false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xb75,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_c8);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        local_50 = 0x18;
        local_40.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_40;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_a8,__l,&local_79);
        local_48.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&local_48;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_00,&local_7a);
        local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        configure_callback = &local_38;
        local_38._M_unused._M_object = (void *)0x0;
        local_38._8_8_ = 0;
        local_28 = 0;
        uStack_20 = 0;
        local_4c = Verify((X509 *)leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_a8,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                          (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_c8,0,
                          (function<void_(x509_store_ctx_st_*)> *)configure_callback);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"24",
                   "Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0)",&local_50,
                   &local_4c);
        std::_Function_base::~_Function_base((_Function_base *)&local_38);
        std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base(&local_c8);
        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_a8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_a8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            message = "";
          }
          else {
            message = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7a,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        iVar1 = X509_check_purpose((X509 *)intermediate._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,-1,
                                   1);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,(internal *)&gtest_ar_,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), -1, 1)","false",
                     "true",configure_callback->_M_pod_data);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7f,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_c8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
          std::__cxx11::string::~string((string *)&local_a8);
          if (local_c8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_c8._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = X509_check_purpose((X509 *)intermediate._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,7,1
                                  );
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,(internal *)&gtest_ar_,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), 7, 1)","false",
                     "true",configure_callback->_M_pod_data);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb81,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_c8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
          std::__cxx11::string::~string((string *)&local_a8);
          if (local_c8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_c8._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = X509_check_purpose((X509 *)intermediate._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,2,1
                                  );
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 == 0;
        if (gtest_ar_.success_) goto LAB_00357298;
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,(internal *)&gtest_ar_,
                   (AssertionResult *)"X509_check_purpose(intermediate.get(), 2, 1)","true","false",
                   configure_callback->_M_pod_data);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xb83,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_c8);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_a8);
  if (local_c8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)(*local_c8._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
  }
LAB_00357298:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&intermediate);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root);
  return;
}

Assistant:

TEST(X509Test, NoBasicConstraintsCertSign) {
  bssl::UniquePtr<X509> root(CertFromPEM(kSANTypesRoot));
  bssl::UniquePtr<X509> intermediate(
      CertFromPEM(kNoBasicConstraintsCertSignIntermediate));
  bssl::UniquePtr<X509> leaf(CertFromPEM(kNoBasicConstraintsCertSignLeaf));

  ASSERT_TRUE(root);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(leaf);

  // The intermediate has keyUsage certSign, but is not marked as a CA in the
  // basicConstraints.
  EXPECT_EQ(X509_V_ERR_INVALID_CA,
            Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0));

  // |X509_check_purpose| with |X509_PURPOSE_ANY| and purpose -1 do not check
  // basicConstraints, but other purpose types do. (This is redundant with the
  // actual basicConstraints check, but |X509_check_purpose| is public API.)
  EXPECT_TRUE(X509_check_purpose(intermediate.get(), -1, /*ca=*/1));
  EXPECT_TRUE(
      X509_check_purpose(intermediate.get(), X509_PURPOSE_ANY, /*ca=*/1));
  EXPECT_FALSE(X509_check_purpose(intermediate.get(), X509_PURPOSE_SSL_SERVER,
                                  /*ca=*/1));
}